

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

void __thiscall
tyti::stl::
stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser(stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_tyti::stl::stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>,_2L>
  local_168;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<tyti::stl::stl_parser_ascii<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_tyti::stl::stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>,_2L>_&>,_2L>
  local_158;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_109;
  string local_108;
  stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_tyti::stl::stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>,_2L>
  *local_d8;
  stl_parser_ascii<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  stl_parser_ascii<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_tyti::stl::stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>,_2L>
  *local_c0;
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_tyti::stl::stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>,_2L>
  that;
  expr_type that_1;
  undefined1 local_21;
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  undefined1 *local_10;
  
  local_e8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"unnamed-grammar",&local_109);
  boost::spirit::qi::
  grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->start,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  stl_parser_ascii<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::stl_parser_ascii(&this->stl_ascii_);
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::stl_parser_binary(&this->stl_binary_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"unnamed-rule",&local_141)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->start,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  local_158.child0 = &this->stl_ascii_;
  local_168.child1 = &this->stl_binary_;
  local_b0 = &boost::spirit::lexeme;
  local_a8 = &boost::spirit::lexeme;
  local_10 = &local_21;
  local_168.child0 = (proto_child0)&boost::spirit::lexeme;
  local_158.child1 = &local_168;
  local_d8 = local_158.child1;
  local_d0 = local_158.child0;
  local_c8 = local_158.child0;
  local_c0 = local_158.child1;
  local_b8 = local_168.child1;
  local_20 = local_168.child1;
  local_18 = local_168.child1;
  boost::spirit::qi::operator%=(&this->start,&local_158);
  return;
}

Assistant:

stl_parser() : stl_parser::base_type(start)
            {
                start %= stl_ascii_ | boost::spirit::qi::lexeme[stl_binary_];
            }